

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

void __thiscall t_xml_generator::write_int_attribute(t_xml_generator *this,string *key,int val)

{
  string local_60;
  string local_40;
  int local_1c;
  string *psStack_18;
  int val_local;
  string *key_local;
  t_xml_generator *this_local;
  
  local_1c = val;
  psStack_18 = key;
  key_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)key);
  number_to_string<int>(&local_60,this,local_1c);
  write_attribute(this,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void t_xml_generator::write_int_attribute(string key, int val) {
  write_attribute(key, number_to_string(val));
}